

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_operationset.c
# Opt level: O2

void FAudio_OPERATIONSET_ClearAll(FAudio *audio)

{
  FAudio_OPERATIONSET_Operation *pFVar1;
  FAudio_OPERATIONSET_Operation *op;
  
  FAudio_PlatformLockMutex(audio->operationLock);
  op = audio->queuedOperations;
  while (op != (FAudio_OPERATIONSET_Operation *)0x0) {
    pFVar1 = op->next;
    DeleteOperation(op,audio->pFree);
    op = pFVar1;
  }
  audio->queuedOperations = (FAudio_OPERATIONSET_Operation *)0x0;
  FAudio_PlatformUnlockMutex(audio->operationLock);
  return;
}

Assistant:

void FAudio_OPERATIONSET_ClearAll(FAudio *audio)
{
	FAudio_OPERATIONSET_Operation *current, *next;

	FAudio_PlatformLockMutex(audio->operationLock);
	LOG_MUTEX_LOCK(audio, audio->operationLock)

	current = audio->queuedOperations;
	while (current != NULL)
	{
		next = current->next;
		DeleteOperation(current, audio->pFree);
		current = next;
	}
	audio->queuedOperations = NULL;

	FAudio_PlatformUnlockMutex(audio->operationLock);
	LOG_MUTEX_UNLOCK(audio, audio->operationLock)
}